

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_coding.cc
# Opt level: O0

void anon_unknown.dwarf_838f::Encode
               (Node *node,string *code,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *codewords)

{
  int iVar1;
  reference this;
  string *in_RDX;
  Node *in_RSI;
  Node *in_RDI;
  int symbol;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_40 [32];
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_RDI != (Node *)0x0) {
    iVar1 = Node::GetSymbol(in_RDI);
    if (iVar1 < 0) {
      Node::GetLeft(in_RDI);
      std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      Encode(in_RSI,in_RDX,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      std::__cxx11::string::~string(local_40);
      Node::GetRight(in_RDI);
      std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      Encode(in_RSI,in_RDX,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    }
    else {
      this = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_RDX,(long)iVar1);
      std::__cxx11::string::operator=((string *)this,(string *)in_RSI);
    }
  }
  return;
}

Assistant:

void Encode(const Node* node, const std::string& code,
            std::vector<std::string>* codewords) {
  if (NULL == node) return;

  const int symbol(node->GetSymbol());
  if (0 <= symbol) {
    (*codewords)[symbol] = code;
  } else {
    Encode(node->GetLeft(), code + "0", codewords);
    Encode(node->GetRight(), code + "1", codewords);
  }
}